

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::Combine<duckdb::KahanAvgState,duckdb::KahanAverageOperation>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  long *plVar3;
  long *plVar4;
  idx_t iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if (count != 0) {
    pdVar1 = source->data;
    pdVar2 = target->data;
    iVar5 = 0;
    do {
      plVar3 = *(long **)(pdVar1 + iVar5 * 8);
      plVar4 = *(long **)(pdVar2 + iVar5 * 8);
      *plVar4 = *plVar4 + *plVar3;
      dVar7 = (double)plVar4[1] + ((double)plVar3[1] - (double)plVar4[2]);
      dVar8 = (dVar7 - (double)plVar4[1]) - ((double)plVar3[1] - (double)plVar4[2]);
      plVar4[2] = (long)dVar8;
      plVar4[1] = (long)dVar7;
      dVar8 = (double)plVar3[2] - dVar8;
      dVar6 = dVar7 + dVar8;
      plVar4[2] = (long)((dVar6 - dVar7) - dVar8);
      plVar4[1] = (long)dVar6;
      iVar5 = iVar5 + 1;
    } while (count != iVar5);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}